

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O3

void test_arithm<unsigned_long>
               (uint length,unsigned_long value1,unsigned_long value2,bool allowTrash)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  _func_int **pp_Var6;
  long lVar7;
  long lVar8;
  _func_int **pp_Var9;
  long lVar10;
  _func_int **pp_Var11;
  long lVar12;
  _func_int **pp_Var13;
  long lVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var16;
  long lVar17;
  undefined8 *puVar18;
  uint uVar19;
  undefined7 in_register_00000009;
  ulong uVar20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var21;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var22;
  uint uVar23;
  uint uVar24;
  long lVar25;
  _func_int **pp_Var26;
  ulong uVar27;
  _func_int **pp_Var28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var29;
  _Atomic_word _Var31;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var30;
  shared_ptr<unsigned_long> pv1;
  shared_ptr<unsigned_long> pv2;
  shared_ptr<unsigned_long> presult;
  
  uVar27 = (ulong)length;
  uVar20 = 0xffffffffffffffff;
  if (-1 < (int)length) {
    uVar20 = uVar27 * 8;
  }
  p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__(uVar20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<unsigned_long*,void(*)(unsigned_long*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv1,p_Var15,
             nosimd::common::free<unsigned_long>);
  pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__(uVar20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<unsigned_long*,void(*)(unsigned_long*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv2,
             pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             nosimd::common::free<unsigned_long>);
  uVar20 = 0xffffffffffffffff;
  if (-1 < (int)(length + 1)) {
    uVar20 = (ulong)(length + 1) * 8;
  }
  pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__(uVar20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<unsigned_long*,void(*)(unsigned_long*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&presult,
             pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             nosimd::common::free<unsigned_long>);
  (&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _vptr__Sp_counted_base)[uVar27] = (_func_int **)0x7f;
  _Var29._M_use_count = (int)value1;
  _Var29._vptr__Sp_counted_base = (_func_int **)value1;
  _Var29._M_weak_count = (_Atomic_word)(value1 >> 0x20);
  uVar23 = (int)length >> 1;
  p_Var22 = p_Var15;
  uVar19 = uVar23;
  uVar24 = uVar23;
  if (3 < (int)uVar23) {
    do {
      *p_Var22 = _Var29;
      p_Var22[1] = _Var29;
      p_Var22[2] = _Var29;
      p_Var22[3] = _Var29;
      uVar19 = uVar24 - 4;
      p_Var22 = p_Var22 + 4;
      bVar1 = 7 < uVar24;
      uVar24 = uVar19;
    } while (bVar1);
  }
  if (1 < (int)uVar19) {
    *p_Var22 = _Var29;
    p_Var22[1] = _Var29;
    uVar19 = uVar19 - 2;
    p_Var22 = p_Var22 + 2;
  }
  if (uVar19 != 0) {
    *p_Var22 = _Var29;
  }
  presult.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       (undefined4)CONCAT71(in_register_00000009,allowTrash);
  _Var31 = (_Atomic_word)(value2 >> 0x20);
  if (length == 0) {
    _Var30._M_use_count = (int)value2;
    _Var30._vptr__Sp_counted_base = (_func_int **)value2;
    _Var30._M_weak_count = _Var31;
LAB_0010adbe:
    pp_Var26 = (_func_int **)(value1 - value2);
LAB_0010adc4:
    if (p_Var15 ==
        pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    goto LAB_0010b262;
LAB_0010add4:
    if (pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
        pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
      if (0 < (int)length) {
        uVar20 = 0;
        do {
          (&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[uVar20] =
               (_func_int **)
               ((long)(&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_vptr__Sp_counted_base)[uVar20] *
               (long)(&p_Var15->_vptr__Sp_counted_base)[uVar20]);
          uVar20 = uVar20 + 1;
        } while (uVar27 != uVar20);
      }
    }
    else if (0 < (int)length) {
      uVar20 = 0;
      do {
        (&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base)[uVar20] =
             (_func_int **)
             ((long)(&(pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                      ._M_pi)->_vptr__Sp_counted_base)[uVar20] *
             (long)(&p_Var15->_vptr__Sp_counted_base)[uVar20]);
        uVar20 = uVar20 + 1;
      } while (uVar27 != uVar20);
    }
    bVar1 = false;
  }
  else {
    lVar25 = (long)(int)length;
    *(unsigned_long *)((long)p_Var15 + lVar25 * 8 + -8) = value1;
    _Var30._M_use_count = (int)value2;
    _Var30._vptr__Sp_counted_base = (_func_int **)value2;
    _Var30._M_weak_count = _Var31;
    _Var16 = pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    uVar24 = uVar23;
    uVar19 = uVar23;
    if (3 < (int)uVar23) {
      do {
        *_Var16._M_pi = _Var30;
        _Var16._M_pi[1] = _Var30;
        _Var16._M_pi[2] = _Var30;
        _Var16._M_pi[3] = _Var30;
        uVar19 = uVar24 - 4;
        _Var16._M_pi = _Var16._M_pi + 4;
        bVar1 = 7 < uVar24;
        uVar24 = uVar19;
      } while (bVar1);
    }
    if (1 < (int)uVar19) {
      *_Var16._M_pi = _Var30;
      _Var16._M_pi[1] = _Var30;
      uVar19 = uVar19 - 2;
      _Var16._M_pi = _Var16._M_pi + 2;
    }
    if (uVar19 != 0) {
      *_Var16._M_pi = _Var30;
    }
    if (length == 0) goto LAB_0010adbe;
    *(unsigned_long *)
     ((long)pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
     lVar25 * 8 + -8) = value2;
    uVar20 = 0;
    do {
      if (((&p_Var15->_vptr__Sp_counted_base)[uVar20] != (_func_int **)value1) ||
         ((&(pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[uVar20] != (_func_int **)value2)) {
        puVar18 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar18 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
        *(undefined4 *)(puVar18 + 1) = 0x1a;
        *(uint *)((long)puVar18 + 0xc) = length;
        __cxa_throw(puVar18,&Exception::typeinfo,0);
      }
      uVar20 = uVar20 + 1;
    } while (uVar27 != uVar20);
    _Var16._M_pi = pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
    _Var21 = pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    p_Var22 = p_Var15;
    uVar19 = uVar23;
    uVar24 = uVar23;
    if (3 < (int)uVar23) {
      do {
        lVar17 = *(long *)&p_Var22->_M_use_count;
        pp_Var26 = p_Var22[1]._vptr__Sp_counted_base;
        lVar4 = *(long *)&p_Var22[1]._M_use_count;
        pp_Var28 = p_Var22[2]._vptr__Sp_counted_base;
        lVar5 = *(long *)&p_Var22[2]._M_use_count;
        pp_Var6 = p_Var22[3]._vptr__Sp_counted_base;
        lVar7 = *(long *)&p_Var22[3]._M_use_count;
        lVar8 = *(long *)&(_Var21._M_pi)->_M_use_count;
        pp_Var9 = _Var21._M_pi[1]._vptr__Sp_counted_base;
        lVar10 = *(long *)&_Var21._M_pi[1]._M_use_count;
        pp_Var11 = _Var21._M_pi[2]._vptr__Sp_counted_base;
        lVar12 = *(long *)&_Var21._M_pi[2]._M_use_count;
        pp_Var13 = _Var21._M_pi[3]._vptr__Sp_counted_base;
        lVar14 = *(long *)&_Var21._M_pi[3]._M_use_count;
        (_Var16._M_pi)->_vptr__Sp_counted_base =
             (_func_int **)
             ((long)(_Var21._M_pi)->_vptr__Sp_counted_base + (long)p_Var22->_vptr__Sp_counted_base);
        *(long *)&(_Var16._M_pi)->_M_use_count = lVar8 + lVar17;
        _Var16._M_pi[1]._vptr__Sp_counted_base = (_func_int **)((long)pp_Var9 + (long)pp_Var26);
        *(long *)&_Var16._M_pi[1]._M_use_count = lVar10 + lVar4;
        _Var16._M_pi[2]._vptr__Sp_counted_base = (_func_int **)((long)pp_Var11 + (long)pp_Var28);
        *(long *)&_Var16._M_pi[2]._M_use_count = lVar12 + lVar5;
        _Var16._M_pi[3]._vptr__Sp_counted_base = (_func_int **)((long)pp_Var13 + (long)pp_Var6);
        *(long *)&_Var16._M_pi[3]._M_use_count = lVar14 + lVar7;
        uVar19 = uVar24 - 4;
        p_Var22 = p_Var22 + 4;
        _Var21._M_pi = _Var21._M_pi + 4;
        _Var16._M_pi = _Var16._M_pi + 4;
        bVar1 = 7 < uVar24;
        uVar24 = uVar19;
      } while (bVar1);
    }
    if (1 < (int)uVar19) {
      lVar17 = *(long *)&p_Var22->_M_use_count;
      lVar4 = *(long *)&(_Var21._M_pi)->_M_use_count;
      (_Var16._M_pi)->_vptr__Sp_counted_base =
           (_func_int **)
           ((long)(_Var21._M_pi)->_vptr__Sp_counted_base + (long)p_Var22->_vptr__Sp_counted_base);
      *(long *)&(_Var16._M_pi)->_M_use_count = lVar4 + lVar17;
      lVar17 = *(long *)&p_Var22[1]._M_use_count;
      lVar4 = *(long *)&_Var21._M_pi[1]._M_use_count;
      _Var16._M_pi[1]._vptr__Sp_counted_base =
           (_func_int **)
           ((long)_Var21._M_pi[1]._vptr__Sp_counted_base + (long)p_Var22[1]._vptr__Sp_counted_base);
      *(long *)&_Var16._M_pi[1]._M_use_count = lVar4 + lVar17;
      uVar19 = uVar19 - 2;
      p_Var22 = p_Var22 + 2;
      _Var21._M_pi = _Var21._M_pi + 2;
      _Var16._M_pi = _Var16._M_pi + 2;
    }
    if (uVar19 != 0) {
      lVar17 = *(long *)&p_Var22->_M_use_count;
      lVar4 = *(long *)&(_Var21._M_pi)->_M_use_count;
      (_Var16._M_pi)->_vptr__Sp_counted_base =
           (_func_int **)
           ((long)(_Var21._M_pi)->_vptr__Sp_counted_base + (long)p_Var22->_vptr__Sp_counted_base);
      *(long *)&(_Var16._M_pi)->_M_use_count = lVar4 + lVar17;
    }
    if (length == 0) goto LAB_0010adbe;
    *(long *)((long)pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi + lVar25 * 8 + -8) =
         *(long *)((long)pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + lVar25 * 8 + -8) +
         *(long *)((long)p_Var15 + lVar25 * 8 + -8);
    uVar20 = 0;
    do {
      if ((&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[uVar20] != (_func_int **)(value2 + value1)) {
        puVar18 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar18 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
        *(undefined4 *)(puVar18 + 1) = 0x22;
        *(uint *)((long)puVar18 + 0xc) = length;
        __cxa_throw(puVar18,&Exception::typeinfo,0);
      }
      uVar20 = uVar20 + 1;
    } while (uVar27 != uVar20);
    _Var16._M_pi = pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
    _Var21 = pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    p_Var22 = p_Var15;
    uVar19 = uVar23;
    uVar24 = uVar23;
    if (3 < (int)uVar23) {
      do {
        lVar17 = *(long *)&p_Var22->_M_use_count;
        pp_Var26 = p_Var22[1]._vptr__Sp_counted_base;
        lVar4 = *(long *)&p_Var22[1]._M_use_count;
        pp_Var28 = p_Var22[2]._vptr__Sp_counted_base;
        lVar5 = *(long *)&p_Var22[2]._M_use_count;
        pp_Var6 = p_Var22[3]._vptr__Sp_counted_base;
        lVar7 = *(long *)&p_Var22[3]._M_use_count;
        lVar8 = *(long *)&(_Var21._M_pi)->_M_use_count;
        pp_Var9 = _Var21._M_pi[1]._vptr__Sp_counted_base;
        lVar10 = *(long *)&_Var21._M_pi[1]._M_use_count;
        pp_Var11 = _Var21._M_pi[2]._vptr__Sp_counted_base;
        lVar12 = *(long *)&_Var21._M_pi[2]._M_use_count;
        pp_Var13 = _Var21._M_pi[3]._vptr__Sp_counted_base;
        lVar14 = *(long *)&_Var21._M_pi[3]._M_use_count;
        (_Var16._M_pi)->_vptr__Sp_counted_base =
             (_func_int **)
             ((long)p_Var22->_vptr__Sp_counted_base - (long)(_Var21._M_pi)->_vptr__Sp_counted_base);
        *(long *)&(_Var16._M_pi)->_M_use_count = lVar17 - lVar8;
        _Var16._M_pi[1]._vptr__Sp_counted_base = (_func_int **)((long)pp_Var26 - (long)pp_Var9);
        *(long *)&_Var16._M_pi[1]._M_use_count = lVar4 - lVar10;
        _Var16._M_pi[2]._vptr__Sp_counted_base = (_func_int **)((long)pp_Var28 - (long)pp_Var11);
        *(long *)&_Var16._M_pi[2]._M_use_count = lVar5 - lVar12;
        _Var16._M_pi[3]._vptr__Sp_counted_base = (_func_int **)((long)pp_Var6 - (long)pp_Var13);
        *(long *)&_Var16._M_pi[3]._M_use_count = lVar7 - lVar14;
        uVar19 = uVar24 - 4;
        p_Var22 = p_Var22 + 4;
        _Var21._M_pi = _Var21._M_pi + 4;
        _Var16._M_pi = _Var16._M_pi + 4;
        bVar1 = 7 < uVar24;
        uVar24 = uVar19;
      } while (bVar1);
    }
    if (1 < (int)uVar19) {
      lVar17 = *(long *)&p_Var22->_M_use_count;
      lVar4 = *(long *)&(_Var21._M_pi)->_M_use_count;
      (_Var16._M_pi)->_vptr__Sp_counted_base =
           (_func_int **)
           ((long)p_Var22->_vptr__Sp_counted_base - (long)(_Var21._M_pi)->_vptr__Sp_counted_base);
      *(long *)&(_Var16._M_pi)->_M_use_count = lVar17 - lVar4;
      lVar17 = *(long *)&p_Var22[1]._M_use_count;
      lVar4 = *(long *)&_Var21._M_pi[1]._M_use_count;
      _Var16._M_pi[1]._vptr__Sp_counted_base =
           (_func_int **)
           ((long)p_Var22[1]._vptr__Sp_counted_base - (long)_Var21._M_pi[1]._vptr__Sp_counted_base);
      *(long *)&_Var16._M_pi[1]._M_use_count = lVar17 - lVar4;
      uVar19 = uVar19 - 2;
      p_Var22 = p_Var22 + 2;
      _Var21._M_pi = _Var21._M_pi + 2;
      _Var16._M_pi = _Var16._M_pi + 2;
    }
    if (uVar19 != 0) {
      lVar17 = *(long *)&p_Var22->_M_use_count;
      lVar4 = *(long *)&(_Var21._M_pi)->_M_use_count;
      (_Var16._M_pi)->_vptr__Sp_counted_base =
           (_func_int **)
           ((long)p_Var22->_vptr__Sp_counted_base - (long)(_Var21._M_pi)->_vptr__Sp_counted_base);
      *(long *)&(_Var16._M_pi)->_M_use_count = lVar17 - lVar4;
    }
    pp_Var26 = (_func_int **)(value1 - value2);
    if (length == 0) goto LAB_0010adc4;
    *(long *)((long)pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi + lVar25 * 8 + -8) =
         *(long *)((long)p_Var15 + lVar25 * 8 + -8) -
         *(long *)((long)pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + lVar25 * 8 + -8);
    uVar20 = 0;
    do {
      if ((&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[uVar20] != pp_Var26) {
        puVar18 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar18 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
        *(undefined4 *)(puVar18 + 1) = 0x2a;
        *(uint *)((long)puVar18 + 0xc) = length;
        __cxa_throw(puVar18,&Exception::typeinfo,0);
      }
      uVar20 = uVar20 + 1;
    } while (uVar27 != uVar20);
    if (p_Var15 !=
        pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    goto LAB_0010add4;
    bVar1 = true;
    if (0 < (int)length) {
      uVar20 = 0;
      do {
        (&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base)[uVar20] =
             (_func_int **)
             ((long)(&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                      ._M_pi)->_vptr__Sp_counted_base)[uVar20] *
             (long)(&(pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_vptr__Sp_counted_base)[uVar20]);
        uVar20 = uVar20 + 1;
        bVar1 = true;
      } while (uVar27 != uVar20);
    }
  }
  if (length != 0) {
    uVar20 = 0;
    do {
      if ((&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[uVar20] != (_func_int **)(value2 * value1)) {
        puVar18 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar18 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
        *(undefined4 *)(puVar18 + 1) = 0x32;
        *(uint *)((long)puVar18 + 0xc) = length;
        __cxa_throw(puVar18,&Exception::typeinfo,0);
      }
      uVar20 = uVar20 + 1;
    } while (uVar27 != uVar20);
  }
  bVar3 = 0 < (int)length;
  if (bVar1) {
    bVar1 = true;
    if ((int)length < 1) {
      bVar3 = false;
    }
    else {
      uVar20 = 0;
      do {
        (&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base)[uVar20] =
             (_func_int **)
             ((ulong)(&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_vptr__Sp_counted_base)[uVar20] /
             (ulong)(&(pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                      ._M_pi)->_vptr__Sp_counted_base)[uVar20]);
        uVar20 = uVar20 + 1;
      } while (uVar27 != uVar20);
    }
  }
  else if ((int)length < 1) {
    bVar3 = false;
    bVar1 = false;
  }
  else {
    uVar20 = 0;
    do {
      (&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base)[uVar20] =
           (_func_int **)
           ((ulong)(&p_Var15->_vptr__Sp_counted_base)[uVar20] /
           (ulong)(&(pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi)->_vptr__Sp_counted_base)[uVar20]);
      uVar20 = uVar20 + 1;
    } while (uVar27 != uVar20);
  }
  if (length == 0) {
LAB_0010b173:
    if (!bVar1) goto LAB_0010b154;
LAB_0010b179:
    bVar1 = true;
    if (!bVar3) goto LAB_0010b19e;
    uVar20 = 0;
    do {
      (&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base)[uVar20] =
           (_func_int **)
           ((long)(&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi)->_vptr__Sp_counted_base)[uVar20] * value2);
      uVar20 = uVar20 + 1;
    } while (uVar27 != uVar20);
  }
  else {
    uVar20 = 0;
    do {
      if ((&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[uVar20] != (_func_int **)(value1 / value2)) {
        puVar18 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar18 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
        *(undefined4 *)(puVar18 + 1) = 0x3a;
        *(uint *)((long)puVar18 + 0xc) = length;
        __cxa_throw(puVar18,&Exception::typeinfo,0);
      }
      uVar20 = uVar20 + 1;
    } while (uVar27 != uVar20);
    pp_Var28 = _Var30._vptr__Sp_counted_base;
    lVar25 = _Var30._8_8_;
    _Var16._M_pi = pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
    p_Var22 = p_Var15;
    uVar19 = uVar23;
    uVar24 = uVar23;
    if (3 < (int)uVar23) {
      do {
        lVar17 = *(long *)&p_Var22->_M_use_count;
        (_Var16._M_pi)->_vptr__Sp_counted_base =
             (_func_int **)((long)p_Var22->_vptr__Sp_counted_base + (long)pp_Var28);
        *(long *)&(_Var16._M_pi)->_M_use_count = lVar17 + lVar25;
        lVar17 = *(long *)&p_Var22[1]._M_use_count;
        _Var16._M_pi[1]._vptr__Sp_counted_base =
             (_func_int **)((long)p_Var22[1]._vptr__Sp_counted_base + (long)pp_Var28);
        *(long *)&_Var16._M_pi[1]._M_use_count = lVar17 + lVar25;
        lVar17 = *(long *)&p_Var22[2]._M_use_count;
        _Var16._M_pi[2]._vptr__Sp_counted_base =
             (_func_int **)((long)p_Var22[2]._vptr__Sp_counted_base + (long)pp_Var28);
        *(long *)&_Var16._M_pi[2]._M_use_count = lVar17 + lVar25;
        lVar17 = *(long *)&p_Var22[3]._M_use_count;
        _Var16._M_pi[3]._vptr__Sp_counted_base =
             (_func_int **)((long)p_Var22[3]._vptr__Sp_counted_base + (long)pp_Var28);
        *(long *)&_Var16._M_pi[3]._M_use_count = lVar17 + lVar25;
        uVar19 = uVar24 - 4;
        p_Var22 = p_Var22 + 4;
        _Var16._M_pi = _Var16._M_pi + 4;
        bVar2 = 7 < uVar24;
        uVar24 = uVar19;
      } while (bVar2);
    }
    if (1 < (int)uVar19) {
      lVar17 = *(long *)&p_Var22->_M_use_count;
      (_Var16._M_pi)->_vptr__Sp_counted_base =
           (_func_int **)((long)p_Var22->_vptr__Sp_counted_base + (long)pp_Var28);
      *(long *)&(_Var16._M_pi)->_M_use_count = lVar17 + lVar25;
      lVar17 = *(long *)&p_Var22[1]._M_use_count;
      _Var16._M_pi[1]._vptr__Sp_counted_base =
           (_func_int **)((long)p_Var22[1]._vptr__Sp_counted_base + (long)pp_Var28);
      *(long *)&_Var16._M_pi[1]._M_use_count = lVar17 + lVar25;
      uVar19 = uVar19 - 2;
      p_Var22 = p_Var22 + 2;
      _Var16._M_pi = _Var16._M_pi + 2;
    }
    if (uVar19 != 0) {
      lVar17 = *(long *)&p_Var22->_M_use_count;
      (_Var16._M_pi)->_vptr__Sp_counted_base =
           (_func_int **)((long)p_Var22->_vptr__Sp_counted_base + (long)pp_Var28);
      *(long *)&(_Var16._M_pi)->_M_use_count = lVar17 + lVar25;
    }
    if (length == 0) goto LAB_0010b173;
    lVar17 = (long)(int)length;
    *(unsigned_long *)
     ((long)pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
     lVar17 * 8 + -8) = *(long *)((long)p_Var15 + lVar17 * 8 + -8) + value2;
    uVar20 = 0;
    do {
      if ((&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[uVar20] != (_func_int **)(value2 + value1)) {
        puVar18 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar18 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
        *(undefined4 *)(puVar18 + 1) = 0x43;
        *(uint *)((long)puVar18 + 0xc) = length;
        __cxa_throw(puVar18,&Exception::typeinfo,0);
      }
      uVar20 = uVar20 + 1;
    } while (uVar27 != uVar20);
    _Var16._M_pi = pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
    p_Var22 = p_Var15;
    uVar19 = uVar23;
    uVar24 = uVar23;
    if (3 < (int)uVar23) {
      do {
        lVar4 = *(long *)&p_Var22->_M_use_count;
        (_Var16._M_pi)->_vptr__Sp_counted_base =
             (_func_int **)((long)p_Var22->_vptr__Sp_counted_base - (long)pp_Var28);
        *(long *)&(_Var16._M_pi)->_M_use_count = lVar4 - lVar25;
        lVar4 = *(long *)&p_Var22[1]._M_use_count;
        _Var16._M_pi[1]._vptr__Sp_counted_base =
             (_func_int **)((long)p_Var22[1]._vptr__Sp_counted_base - (long)pp_Var28);
        *(long *)&_Var16._M_pi[1]._M_use_count = lVar4 - lVar25;
        lVar4 = *(long *)&p_Var22[2]._M_use_count;
        _Var16._M_pi[2]._vptr__Sp_counted_base =
             (_func_int **)((long)p_Var22[2]._vptr__Sp_counted_base - (long)pp_Var28);
        *(long *)&_Var16._M_pi[2]._M_use_count = lVar4 - lVar25;
        lVar4 = *(long *)&p_Var22[3]._M_use_count;
        _Var16._M_pi[3]._vptr__Sp_counted_base =
             (_func_int **)((long)p_Var22[3]._vptr__Sp_counted_base - (long)pp_Var28);
        *(long *)&_Var16._M_pi[3]._M_use_count = lVar4 - lVar25;
        uVar19 = uVar24 - 4;
        p_Var22 = p_Var22 + 4;
        _Var16._M_pi = _Var16._M_pi + 4;
        bVar2 = 7 < uVar24;
        uVar24 = uVar19;
      } while (bVar2);
    }
    if (1 < (int)uVar19) {
      lVar4 = *(long *)&p_Var22->_M_use_count;
      (_Var16._M_pi)->_vptr__Sp_counted_base =
           (_func_int **)((long)p_Var22->_vptr__Sp_counted_base - (long)pp_Var28);
      *(long *)&(_Var16._M_pi)->_M_use_count = lVar4 - lVar25;
      lVar4 = *(long *)&p_Var22[1]._M_use_count;
      _Var16._M_pi[1]._vptr__Sp_counted_base =
           (_func_int **)((long)p_Var22[1]._vptr__Sp_counted_base - (long)pp_Var28);
      *(long *)&_Var16._M_pi[1]._M_use_count = lVar4 - lVar25;
      uVar19 = uVar19 - 2;
      p_Var22 = p_Var22 + 2;
      _Var16._M_pi = _Var16._M_pi + 2;
    }
    if (uVar19 != 0) {
      lVar4 = *(long *)&p_Var22->_M_use_count;
      (_Var16._M_pi)->_vptr__Sp_counted_base =
           (_func_int **)((long)p_Var22->_vptr__Sp_counted_base - (long)pp_Var28);
      *(long *)&(_Var16._M_pi)->_M_use_count = lVar4 - lVar25;
    }
    if (length == 0) goto LAB_0010b173;
    *(unsigned_long *)
     ((long)pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
     lVar17 * 8 + -8) = *(long *)((long)p_Var15 + lVar17 * 8 + -8) - value2;
    uVar20 = 0;
    do {
      if ((&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[uVar20] != pp_Var26) {
        puVar18 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar18 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
        *(undefined4 *)(puVar18 + 1) = 0x4b;
        *(uint *)((long)puVar18 + 0xc) = length;
        __cxa_throw(puVar18,&Exception::typeinfo,0);
      }
      uVar20 = uVar20 + 1;
    } while (uVar27 != uVar20);
    _Var16._M_pi = pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
    p_Var22 = p_Var15;
    uVar19 = uVar23;
    if (3 < (int)uVar23) {
      do {
        lVar4 = *(long *)&p_Var22->_M_use_count;
        (_Var16._M_pi)->_vptr__Sp_counted_base =
             (_func_int **)((long)pp_Var28 - (long)p_Var22->_vptr__Sp_counted_base);
        *(long *)&(_Var16._M_pi)->_M_use_count = lVar25 - lVar4;
        lVar4 = *(long *)&p_Var22[1]._M_use_count;
        _Var16._M_pi[1]._vptr__Sp_counted_base =
             (_func_int **)((long)pp_Var28 - (long)p_Var22[1]._vptr__Sp_counted_base);
        *(long *)&_Var16._M_pi[1]._M_use_count = lVar25 - lVar4;
        lVar4 = *(long *)&p_Var22[2]._M_use_count;
        _Var16._M_pi[2]._vptr__Sp_counted_base =
             (_func_int **)((long)pp_Var28 - (long)p_Var22[2]._vptr__Sp_counted_base);
        *(long *)&_Var16._M_pi[2]._M_use_count = lVar25 - lVar4;
        lVar4 = *(long *)&p_Var22[3]._M_use_count;
        _Var16._M_pi[3]._vptr__Sp_counted_base =
             (_func_int **)((long)pp_Var28 - (long)p_Var22[3]._vptr__Sp_counted_base);
        *(long *)&_Var16._M_pi[3]._M_use_count = lVar25 - lVar4;
        uVar19 = uVar23 - 4;
        p_Var22 = p_Var22 + 4;
        _Var16._M_pi = _Var16._M_pi + 4;
        bVar2 = 7 < uVar23;
        uVar23 = uVar19;
      } while (bVar2);
    }
    if (1 < (int)uVar19) {
      lVar4 = *(long *)&p_Var22->_M_use_count;
      (_Var16._M_pi)->_vptr__Sp_counted_base =
           (_func_int **)((long)pp_Var28 - (long)p_Var22->_vptr__Sp_counted_base);
      *(long *)&(_Var16._M_pi)->_M_use_count = lVar25 - lVar4;
      lVar4 = *(long *)&p_Var22[1]._M_use_count;
      _Var16._M_pi[1]._vptr__Sp_counted_base =
           (_func_int **)((long)pp_Var28 - (long)p_Var22[1]._vptr__Sp_counted_base);
      *(long *)&_Var16._M_pi[1]._M_use_count = lVar25 - lVar4;
      uVar19 = uVar19 - 2;
      p_Var22 = p_Var22 + 2;
      _Var16._M_pi = _Var16._M_pi + 2;
    }
    if (uVar19 != 0) {
      lVar4 = *(long *)&p_Var22->_M_use_count;
      (_Var16._M_pi)->_vptr__Sp_counted_base =
           (_func_int **)((long)pp_Var28 - (long)p_Var22->_vptr__Sp_counted_base);
      *(long *)&(_Var16._M_pi)->_M_use_count = lVar25 - lVar4;
    }
    if (length == 0) goto LAB_0010b173;
    *(unsigned_long *)
     ((long)pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
     lVar17 * 8 + -8) = value2 - *(long *)((long)p_Var15 + lVar17 * 8 + -8);
    uVar20 = 0;
    do {
      if ((&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[uVar20] != (_func_int **)(value2 - value1)) {
        puVar18 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar18 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
        *(undefined4 *)(puVar18 + 1) = 0x53;
        *(uint *)((long)puVar18 + 0xc) = length;
        __cxa_throw(puVar18,&Exception::typeinfo,0);
      }
      uVar20 = uVar20 + 1;
    } while (uVar27 != uVar20);
    if (bVar1) goto LAB_0010b179;
LAB_0010b154:
    if (bVar3) {
      uVar20 = 0;
      do {
        (&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base)[uVar20] =
             (_func_int **)((long)(&p_Var15->_vptr__Sp_counted_base)[uVar20] * value2);
        uVar20 = uVar20 + 1;
      } while (uVar27 != uVar20);
      bVar1 = false;
    }
    else {
      bVar1 = false;
LAB_0010b19e:
      bVar3 = false;
    }
  }
  if (length != 0) {
    uVar20 = 0;
    do {
      if ((&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[uVar20] != (_func_int **)(value2 * value1)) {
        puVar18 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar18 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
        *(undefined4 *)(puVar18 + 1) = 0x5b;
        *(uint *)((long)puVar18 + 0xc) = length;
        __cxa_throw(puVar18,&Exception::typeinfo,0);
      }
      uVar20 = uVar20 + 1;
    } while (uVar27 != uVar20);
  }
  if (bVar1) {
    if (bVar3) {
      uVar20 = 0;
      do {
        (&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base)[uVar20] =
             (_func_int **)
             ((ulong)(&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_vptr__Sp_counted_base)[uVar20] / value2);
        uVar20 = uVar20 + 1;
      } while (uVar27 != uVar20);
    }
    else {
LAB_0010b200:
      bVar3 = false;
    }
  }
  else {
    if (!bVar3) goto LAB_0010b200;
    uVar20 = 0;
    do {
      (&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base)[uVar20] =
           (_func_int **)((ulong)(&p_Var15->_vptr__Sp_counted_base)[uVar20] / value2);
      uVar20 = uVar20 + 1;
    } while (uVar27 != uVar20);
  }
  if (length != 0) {
    uVar20 = 0;
    do {
      if ((&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[uVar20] != (_func_int **)(value1 / value2)) {
        puVar18 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar18 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
        *(undefined4 *)(puVar18 + 1) = 99;
        *(uint *)((long)puVar18 + 0xc) = length;
        __cxa_throw(puVar18,&Exception::typeinfo,0);
      }
      uVar20 = uVar20 + 1;
    } while (uVar27 != uVar20);
  }
  if (bVar3) {
    uVar20 = 0;
    do {
      (&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base)[uVar20] =
           (_func_int **)(value2 / (ulong)(&p_Var15->_vptr__Sp_counted_base)[uVar20]);
      uVar20 = uVar20 + 1;
    } while (uVar27 != uVar20);
  }
  if (length != 0) {
    uVar20 = 0;
    do {
      if ((&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[uVar20] != (_func_int **)(value2 / value1)) {
        puVar18 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar18 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
        *(undefined4 *)(puVar18 + 1) = 0x6b;
        *(uint *)((long)puVar18 + 0xc) = length;
        __cxa_throw(puVar18,&Exception::typeinfo,0);
      }
      uVar20 = uVar20 + 1;
    } while (uVar27 != uVar20);
  }
LAB_0010b262:
  if ((!allowTrash) &&
     ((&(pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base)[uVar27] != (_func_int **)0x7f)) {
    puVar18 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar18 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
    *(undefined4 *)(puVar18 + 1) = 0x70;
    *(uint *)((long)puVar18 + 0xc) = length;
    __cxa_throw(puVar18,&Exception::typeinfo,0);
  }
  if (presult.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               presult.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pv1.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void test_arithm(unsigned length, T value1, T value2, bool allowTrash = false)
{
    auto pv1 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto pv2 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto presult = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * v1 = pv1.get();
    T * v2 = pv2.get();
    T * result = presult.get();
    result[length] = 0x7f;

    simd::set(value1, v1, length);
    simd::set(value2, v2, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(v1[i], value1) || ! equal(v2[i], value2))
            FAIL();
    }

    T r = value1 + value2;
    arithm::add(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    arithm::sub(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    arithm::mul(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 / value2;
    arithm::div(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

#ifndef TEST_FIXED
    r = value1 + value2;
    simd::addC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    simd::subC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value2 - value1;
    simd::subCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    simd::mulC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value1 / value2;
    simd::divC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value2 / value1;
    simd::divCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }
#endif // TEST_FIXED

    if (!allowTrash && result[length] != 0x7f)
        FAIL();
}